

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

Vec_Ptr_t *
Llb_Nonlin4SweepPartitions(DdManager *dd,Aig_Man_t *pAig,Vec_Int_t *vOrder,int fTransition)

{
  Vec_Ptr_t *vRoots;
  void **ppvVar1;
  Aig_Obj_t *pAVar2;
  void *pvVar3;
  int iVar4;
  
  Aig_ManCleanData(pAig);
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar1 = (void **)malloc(800);
  vRoots->pArray = ppvVar1;
  if (fTransition == 0) {
    for (iVar4 = 0; iVar4 < pAig->nTruePos; iVar4 = iVar4 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar4);
      Llb_Nonlin4SweepPartitions_rec(dd,pAVar2,vOrder,vRoots);
    }
  }
  else {
    for (iVar4 = 0; iVar4 < pAig->nRegs; iVar4 = iVar4 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar4);
      Llb_Nonlin4SweepPartitions_rec(dd,pAVar2,vOrder,vRoots);
    }
  }
  for (iVar4 = 0; iVar4 < pAig->vObjs->nSize; iVar4 = iVar4 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vObjs,iVar4);
    if (((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) &&
       (*(DdNode **)((long)pvVar3 + 0x28) != (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar3 + 0x28));
    }
  }
  return vRoots;
}

Assistant:

Vec_Ptr_t * Llb_Nonlin4SweepPartitions( DdManager * dd, Aig_Man_t * pAig, Vec_Int_t * vOrder, int fTransition )
{
    Vec_Ptr_t * vRoots;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanData( pAig );
    vRoots = Vec_PtrAlloc( 100 );
    if ( fTransition )
    {
        Saig_ManForEachLi( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
            Llb_Nonlin4SweepPartitions_rec( dd, pObj, vOrder, vRoots );
    }
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    return vRoots;
}